

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniz.c
# Opt level: O0

mz_bool mz_zip_validate_mem_archive(void *pMem,size_t size,mz_uint flags,mz_zip_error *pErr)

{
  mz_bool mVar1;
  mz_zip_mode local_ac;
  undefined1 local_a8 [4];
  mz_zip_error actual_err;
  mz_zip_archive zip;
  mz_bool success;
  mz_zip_error *pErr_local;
  mz_uint flags_local;
  size_t size_local;
  void *pMem_local;
  
  zip.m_pState._4_4_ = 1;
  local_ac = MZ_ZIP_MODE_INVALID;
  if ((pMem == (void *)0x0) || (size == 0)) {
    if (pErr != (mz_zip_error *)0x0) {
      *pErr = MZ_ZIP_INVALID_PARAMETER;
    }
    pMem_local._4_4_ = 0;
  }
  else {
    mz_zip_zero_struct((mz_zip_archive *)local_a8);
    mVar1 = mz_zip_reader_init_mem((mz_zip_archive *)local_a8,pMem,size,flags);
    if (mVar1 == 0) {
      if (pErr != (mz_zip_error *)0x0) {
        *pErr = zip.m_zip_mode;
      }
      pMem_local._4_4_ = 0;
    }
    else {
      mVar1 = mz_zip_validate_archive((mz_zip_archive *)local_a8,flags);
      if (mVar1 == 0) {
        local_ac = zip.m_zip_mode;
        zip.m_pState._4_4_ = 0;
      }
      mVar1 = mz_zip_reader_end_internal((mz_zip_archive *)local_a8,zip.m_pState._4_4_);
      if (mVar1 == 0) {
        if (local_ac == MZ_ZIP_MODE_INVALID) {
          local_ac = zip.m_zip_mode;
        }
        zip.m_pState._4_4_ = 0;
      }
      if (pErr != (mz_zip_error *)0x0) {
        *pErr = local_ac;
      }
      pMem_local._4_4_ = zip.m_pState._4_4_;
    }
  }
  return pMem_local._4_4_;
}

Assistant:

mz_bool mz_zip_validate_mem_archive(const void *pMem, size_t size, mz_uint flags, mz_zip_error *pErr)
{
    mz_bool success = MZ_TRUE;
    mz_zip_archive zip;
    mz_zip_error actual_err = MZ_ZIP_NO_ERROR;

    if ((!pMem) || (!size))
    {
        if (pErr)
            *pErr = MZ_ZIP_INVALID_PARAMETER;
        return MZ_FALSE;
    }

    mz_zip_zero_struct(&zip);

    if (!mz_zip_reader_init_mem(&zip, pMem, size, flags))
    {
        if (pErr)
            *pErr = zip.m_last_error;
        return MZ_FALSE;
    }

    if (!mz_zip_validate_archive(&zip, flags))
    {
        actual_err = zip.m_last_error;
        success = MZ_FALSE;
    }

    if (!mz_zip_reader_end_internal(&zip, success))
    {
        if (!actual_err)
            actual_err = zip.m_last_error;
        success = MZ_FALSE;
    }

    if (pErr)
        *pErr = actual_err;

    return success;
}